

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_long>
          (RecyclableObject *pObj,unsigned_long len,unsigned_long start,unsigned_long deleteLen,
          Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  BOOL BVar1;
  JavascriptArray *pJVar2;
  Var pvVar3;
  uint uVar4;
  uint32 i;
  uint64 uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  bool bVar8;
  BigIndex idxDest;
  BigIndex index;
  BigIndex local_c0;
  Var *local_b0;
  BigIndex local_a8;
  JavascriptArray *local_98;
  unsigned_long local_90;
  ulong local_88;
  unsigned_long local_80;
  uint32 local_74;
  unsigned_long local_70;
  ScriptContext *local_68;
  ThrowTypeErrorOnFailureHelper h;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  local_b0 = insertArgs;
  local_80 = len;
  local_74 = insertLen;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pObj);
  h.m_functionName = (PCWSTR)pNewObj;
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    h.m_functionName =
         (PCWSTR)ArraySpeciesCreate<unsigned_long>
                           (pObj,deleteLen,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    *(bool *)((long)local_50 + 0x108) = true;
    if ((RecyclableObject *)h.m_functionName == (RecyclableObject *)0x0) {
      if (deleteLen >> 0x20 != 0) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
      }
      h.m_functionName =
           (PCWSTR)JavascriptLibrary::CreateArray
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                              (uint32)deleteLen);
      EnsureHead<void*>((JavascriptArray *)h.m_functionName);
    }
  }
  pJVar2 = TryVarToNonES5Array(h.m_functionName);
  local_98 = pJVar2;
  local_90 = start;
  local_70 = deleteLen;
  if (pJVar2 == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)&local_68,0);
    uVar6 = deleteLen;
    while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, deleteLen = local_70, bVar8) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar1 = JavascriptOperators::HasItem(pObj,start);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
      if (BVar1 != 0) {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar3 = JavascriptOperators::GetItem(pObj,start,scriptContext);
        idxDest.bigIndex = (uint64)pvVar3;
        idxDest._0_8_ = h.m_scriptContext;
        uVar4 = SetArrayLikeObjects((JavascriptArray *)h.m_functionName,
                                    (RecyclableObject *)((ulong)local_68 & 0xffffffff),idxDest,
                                    insertArgs);
        index.bigIndex = (uint64)insertArgs;
        index._0_8_ = h.m_scriptContext;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar4,(BOOL)scriptContext,
                            (ScriptContext *)((ulong)local_68 & 0xffffffff),index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
      }
      if ((uint32)local_68 == 0xffffffff) {
        h.m_scriptContext =
             (ScriptContext *)
             ((long)&((h.m_scriptContext)->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1);
      }
      else {
        local_68 = (ScriptContext *)CONCAT44(local_68._4_4_,(uint32)local_68 + 1);
      }
      start = start + 1;
    }
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar2);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_50,pJVar2);
    for (uVar4 = 0; uVar7 = (ulong)uVar4, uVar7 < deleteLen; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar5 = uVar7 + local_90;
      BVar1 = JavascriptOperators::HasItem(pObj,uVar5);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
      if (BVar1 != 0) {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar3 = JavascriptOperators::GetItem(pObj,uVar5,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        (*(local_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_98,uVar7,pvVar3,0);
      }
      deleteLen = local_70;
    }
  }
  uVar6 = local_90;
  local_68 = scriptContext;
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940f86;
  local_88 = (ulong)local_74;
  if (deleteLen < local_88) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex(&local_a8,local_88 + local_90);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
              (pObj,&local_a8,deleteLen + uVar6,local_80,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
  }
  else if (local_88 < deleteLen) {
    uVar5 = local_90 + local_88;
    for (uVar7 = local_70 + local_90; uVar7 < local_80; uVar7 = uVar7 + 1) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar1 = JavascriptOperators::HasItem(pObj,uVar7);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar1 == 0) {
        BVar1 = JavascriptOperators::DeleteItem
                          (pObj,uVar5,PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      }
      else {
        pvVar3 = JavascriptOperators::GetItem(pObj,uVar7,scriptContext);
        BVar1 = JavascriptOperators::SetItem
                          (pObj,pObj,uVar5,pvVar3,scriptContext,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      }
      *(bool *)((long)local_50 + 0x108) = true;
      uVar5 = uVar5 + 1;
    }
    uVar7 = (local_80 - local_70) + local_88;
    uVar6 = local_80;
    while (uVar7 < uVar6) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar6 = uVar6 - 1;
      BVar1 = JavascriptOperators::DeleteItem(pObj,uVar6,PropertyOperation_ThrowOnDeleteIfNotConfig)
      ;
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
    }
  }
  if (local_74 != 0) {
    for (uVar7 = 0; local_88 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BigIndex::BigIndex(&local_a8,local_90 + uVar7);
      BVar1 = BigIndex::SetItem(&local_a8,pObj,local_b0[uVar7],
                                PropertyOperation_ThrowIfNotExtensible);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
    }
  }
  uVar6 = local_70;
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex(&local_a8,(local_80 - local_70) + local_88);
  pvVar3 = BigIndex::ToNumber(&local_a8,scriptContext);
  BVar1 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar3,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
  BigIndex::BigIndex(&local_c0,uVar6);
  pJVar2 = local_98;
  pvVar3 = BigIndex::ToNumber(&local_c0,scriptContext);
  BVar1 = JavascriptOperators::SetProperty
                    (h.m_functionName,(RecyclableObject *)h.m_functionName,0xd1,pvVar3,scriptContext
                     ,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)&local_68,BVar1);
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  *(bool *)((long)local_50 + 0x108) = true;
  if (pJVar2 != (JavascriptArray *)0x0) {
    (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar2);
  }
  ((ThreadContext *)local_50)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)h.m_functionName;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }